

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O3

int is_timeout_reached(time_t start_time,uint timeout_in_secs,_Bool *is_timed_out)

{
  time_t stopTime;
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  double dVar5;
  
  if (start_time == -1) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0xec;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0xec;
    }
    pcVar4 = "Failed to verify timeout (start_time is INDEFINITE)";
    iVar2 = 0xeb;
  }
  else if (is_timed_out == (_Bool *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0xf1;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0xf1;
    }
    pcVar4 = "Failed to verify timeout (is_timed_out is NULL)";
    iVar2 = 0xf0;
  }
  else {
    stopTime = get_time((time_t *)0x0);
    if (stopTime != -1) {
      dVar5 = get_difftime(stopTime,start_time);
      *is_timed_out = (double)timeout_in_secs <= dVar5;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0xfa;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0xfa;
    }
    pcVar4 = "Failed to verify timeout (get_time failed)";
    iVar2 = 0xf9;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
            ,"is_timeout_reached",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int is_timeout_reached(time_t start_time, unsigned int timeout_in_secs, bool* is_timed_out)
{
    int result;

    if (start_time == INDEFINITE_TIME)
    {
        LogError("Failed to verify timeout (start_time is INDEFINITE)");
        result = MU_FAILURE;
    }
    else if (is_timed_out == NULL)
    {
        LogError("Failed to verify timeout (is_timed_out is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        time_t current_time;

        if ((current_time = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Failed to verify timeout (get_time failed)");
            result = MU_FAILURE;
        }
        else
        {
            if (get_difftime(current_time, start_time) >= timeout_in_secs)
            {
                *is_timed_out = true;
            }
            else
            {
                *is_timed_out = false;
            }

            result = RESULT_OK;
        }
    }

    return result;
}